

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O3

void __thiscall
embree::XMLWriter::store_array_binary<unsigned_int>
          (XMLWriter *this,char *name,vector<unsigned_int,_std::allocator<unsigned_int>_> *vec)

{
  undefined1 *puVar1;
  pointer puVar2;
  size_t sVar3;
  ostream *poVar4;
  ulong uVar5;
  
  std::istream::tellg();
  if (this->ident != 0) {
    uVar5 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x10," ",1);
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->ident);
  }
  puVar1 = &this->field_0x10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"<",1);
  if (name == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(*(long *)puVar1 + -0x18) + (int)puVar1);
  }
  else {
    sVar3 = strlen(name);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,name,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1," ofs=\"",6);
  poVar4 = std::ostream::_M_insert<long>((long)puVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" size=\"",8);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"/>",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  puVar2 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    std::ostream::write(&this->field_0x220,(long)puVar2);
    return;
  }
  return;
}

Assistant:

void XMLWriter::store_array_binary(const char* name, const std::vector<T>& vec)
  {
    std::streampos offset = bin.tellg();
    tab(); xml << "<" << name << " ofs=\"" << offset << "\" size=\"" << vec.size() << "\"/>" << std::endl;
    if (vec.size()) bin.write((char*)vec.data(),vec.size()*sizeof(T));
  }